

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O0

bool icu_63::numparse::impl::StringSegment::codePointsEqual(UChar32 cp1,UChar32 cp2,bool foldCase)

{
  UChar32 UVar1;
  UChar32 UVar2;
  bool foldCase_local;
  UChar32 cp2_local;
  UChar32 cp1_local;
  
  if (cp1 == cp2) {
    cp2_local._3_1_ = true;
  }
  else if (foldCase) {
    UVar1 = u_foldCase_63(cp1,1);
    UVar2 = u_foldCase_63(cp2,1);
    cp2_local._3_1_ = UVar1 == UVar2;
  }
  else {
    cp2_local._3_1_ = false;
  }
  return cp2_local._3_1_;
}

Assistant:

bool StringSegment::codePointsEqual(UChar32 cp1, UChar32 cp2, bool foldCase) {
    if (cp1 == cp2) {
        return true;
    }
    if (!foldCase) {
        return false;
    }
    cp1 = u_foldCase(cp1, TRUE);
    cp2 = u_foldCase(cp2, TRUE);
    return cp1 == cp2;
}